

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server-ws.c
# Opt level: O0

int lws_process_ws_upgrade2(lws *wsi)

{
  code *pcVar1;
  lws_dll2 *plVar2;
  lws_context_per_thread *plVar3;
  int iVar4;
  lws_check_basic_auth_results lVar5;
  void *pvVar6;
  char *pcVar7;
  char *local_30;
  char *ws_prot_basic_auth;
  lws_protocol_vhost_options *pvos;
  lws_context_per_thread *pt;
  lws *wsi_local;
  
  pvos = (lws_protocol_vhost_options *)(wsi->context->pt + (int)wsi->tsi);
  ws_prot_basic_auth = (char *)0x0;
  local_30 = (char *)0x0;
  pt = (lws_context_per_thread *)wsi;
  ws_prot_basic_auth = (char *)lws_vhost_protocol_options(wsi->vhost,wsi->protocol->name);
  if ((((lws_protocol_vhost_options *)ws_prot_basic_auth != (lws_protocol_vhost_options *)0x0) &&
      (((lws_protocol_vhost_options *)ws_prot_basic_auth)->options !=
       (lws_protocol_vhost_options *)0x0)) &&
     (iVar4 = lws_pvo_get_str(((lws_protocol_vhost_options *)ws_prot_basic_auth)->options,
                              "basic-auth",&local_30), iVar4 == 0)) {
    _lws_log(8,"%s: ws upgrade requires basic auth\n","lws_process_ws_upgrade2");
    lVar5 = lws_check_basic_auth((lws *)pt,local_30,0);
    if (lVar5 != LCBA_CONTINUE) {
      if (lVar5 == LCBA_FAILED_AUTH) {
        iVar4 = lws_unauthorised_basic_auth((lws *)pt);
        return iVar4;
      }
      if (lVar5 == LCBA_END_TRANSACTION) {
        lws_return_http_status((lws *)pt,0x193,(char *)0x0);
        iVar4 = lws_http_transaction_completed((lws *)pt);
        return iVar4;
      }
    }
  }
  if ((*(ulong *)((long)&pt[1].http.ah_list + 4) >> 4 & 1) == 0) {
    lws_role_transition((lws *)pt,0x20000000,LRS_ESTABLISHED,&role_ops_ws);
  }
  pvVar6 = lws_zalloc(0xc0,"ws struct");
  (pt->sul_ah_lifecheck).us = (lws_usec_t)pvVar6;
  if ((pt->sul_ah_lifecheck).us == 0) {
    _lws_log(4,"OOM\n");
    wsi_local._4_4_ = 1;
  }
  else {
    iVar4 = lws_hdr_total_length((lws *)pt,WSI_TOKEN_VERSION);
    if (iVar4 != 0) {
      pcVar7 = lws_hdr_simple_ptr((lws *)pt,WSI_TOKEN_VERSION);
      iVar4 = atoi(pcVar7);
      *(char *)((pt->sul_ah_lifecheck).us + 0xb9) = (char)iVar4;
    }
    iVar4 = lws_ensure_user_space((lws *)pt);
    plVar3 = pt;
    if (iVar4 == 0) {
      pcVar1 = *(code **)(pt[1].sul_ah_lifecheck.cb + 8);
      plVar2 = pt[1].sul_plat.list.next;
      pcVar7 = lws_hdr_simple_ptr((lws *)pt,WSI_TOKEN_PROTOCOL);
      iVar4 = (*pcVar1)(plVar3,0x14,plVar2,pcVar7,0);
      if (iVar4 == 0) {
        if (*(char *)((pt->sul_ah_lifecheck).us + 0xb9) != '\r') {
          _lws_log(4,"Unknown client spec version %d\n",
                   (ulong)*(byte *)((pt->sul_ah_lifecheck).us + 0xb9));
          *(undefined1 *)((pt->sul_ah_lifecheck).us + 0xb9) = 0xd;
        }
        if ((*(ulong *)((long)&pt[1].http.ah_list + 4) >> 4 & 1) == 0) {
          _lws_log(0x20,"lws_parse calling handshake_04\n");
          iVar4 = handshake_0405((lws_context *)pt[1].sul_seq_heartbeat.list.owner,(lws *)pt);
          if (iVar4 != 0) {
            _lws_log(4,"hs0405 has failed the connection\n");
            return 1;
          }
        }
        else {
          iVar4 = lws_h2_ws_handshake((lws *)pt);
          if (iVar4 != 0) {
            _lws_log(4,"h2 ws handshake failed\n");
            return 1;
          }
          lws_role_transition((lws *)pt,0x21000000,LRS_ESTABLISHED,&role_ops_ws);
          __lws_sul_insert((lws_dll2_owner_t *)&pvos[2].options,
                           (lws_sorted_usec_list_t *)pt->dummy_pipe_fds,-1);
        }
        lws_server_init_wsi_for_ws((lws *)pt);
        _lws_log(0x20,"accepted v%02d connection\n",
                 (ulong)*(byte *)((pt->sul_ah_lifecheck).us + 0xb9));
        _lws_log(8,"%s: %p: dropping ah on ws upgrade\n","lws_process_ws_upgrade2",pt);
        lws_header_table_detach((lws *)pt,1);
        wsi_local._4_4_ = 0;
      }
      else {
        _lws_log(2,"User code denied connection\n");
        wsi_local._4_4_ = 1;
      }
    }
    else {
      _lws_log(4,"problem with user space\n");
      wsi_local._4_4_ = 1;
    }
  }
  return wsi_local._4_4_;
}

Assistant:

int
lws_process_ws_upgrade2(struct lws *wsi)
{
	struct lws_context_per_thread *pt = &wsi->context->pt[(int)wsi->tsi];
	const struct lws_protocol_vhost_options *pvos = NULL;
	const char *ws_prot_basic_auth = NULL;

	/*
	 * Allow basic auth a look-in now we bound the wsi to the protocol.
	 *
	 * For vhost ws basic auth, it is "basic-auth": "path" as usual but
	 * applied to the protocol's entry in the vhost's "ws-protocols":
	 * section, as a pvo.
	 */

	pvos = lws_vhost_protocol_options(wsi->vhost, wsi->protocol->name);
	if (pvos && pvos->options &&
	    !lws_pvo_get_str((void *)pvos->options, "basic-auth",
			     &ws_prot_basic_auth)) {
		lwsl_info("%s: ws upgrade requires basic auth\n", __func__);
		switch (lws_check_basic_auth(wsi, ws_prot_basic_auth, LWSAUTHM_DEFAULT
						/* no callback based auth here */)) {
		case LCBA_CONTINUE:
			break;
		case LCBA_FAILED_AUTH:
			return lws_unauthorised_basic_auth(wsi);
		case LCBA_END_TRANSACTION:
			lws_return_http_status(wsi, HTTP_STATUS_FORBIDDEN, NULL);
			return lws_http_transaction_completed(wsi);
		}
	}

	/*
	 * We are upgrading to ws, so http/1.1 + h2 and keepalive + pipelined
	 * header considerations about keeping the ah around no longer apply.
	 *
	 * However it's common for the first ws protocol data to have been
	 * coalesced with the browser upgrade request and to already be in the
	 * ah rx buffer.
	 */

	lws_pt_lock(pt, __func__);

	if (!wsi->h2_stream_carries_ws)
		lws_role_transition(wsi, LWSIFR_SERVER, LRS_ESTABLISHED,
				    &role_ops_ws);

	lws_pt_unlock(pt);

	/* allocate the ws struct for the wsi */

	wsi->ws = lws_zalloc(sizeof(*wsi->ws), "ws struct");
	if (!wsi->ws) {
		lwsl_notice("OOM\n");
		return 1;
	}

	if (lws_hdr_total_length(wsi, WSI_TOKEN_VERSION))
		wsi->ws->ietf_spec_revision =
			       atoi(lws_hdr_simple_ptr(wsi, WSI_TOKEN_VERSION));

	/* allocate wsi->user storage */
	if (lws_ensure_user_space(wsi)) {
		lwsl_notice("problem with user space\n");
		return 1;
	}

	/*
	 * Give the user code a chance to study the request and
	 * have the opportunity to deny it
	 */
	if ((wsi->protocol->callback)(wsi,
			LWS_CALLBACK_FILTER_PROTOCOL_CONNECTION,
			wsi->user_space,
		      lws_hdr_simple_ptr(wsi, WSI_TOKEN_PROTOCOL), 0)) {
		lwsl_warn("User code denied connection\n");
		return 1;
	}

	/*
	 * Perform the handshake according to the protocol version the
	 * client announced
	 */

	switch (wsi->ws->ietf_spec_revision) {
	default:
		lwsl_notice("Unknown client spec version %d\n",
			  wsi->ws->ietf_spec_revision);
		wsi->ws->ietf_spec_revision = 13;
		//return 1;
		/* fallthru */
	case 13:
#if defined(LWS_WITH_HTTP2)
		if (wsi->h2_stream_carries_ws) {
			if (lws_h2_ws_handshake(wsi)) {
				lwsl_notice("h2 ws handshake failed\n");
				return 1;
			}
			lws_role_transition(wsi,
					    LWSIFR_SERVER | LWSIFR_P_ENCAP_H2,
					    LRS_ESTABLISHED, &role_ops_ws);

			/*
			 * There should be no validity checking since we
			 * are encapsulated in something else with its own
			 * validity checking
			 */

			__lws_sul_insert(&pt->pt_sul_owner, &wsi->sul_validity,
					 LWS_SET_TIMER_USEC_CANCEL);
		} else
#endif
		{
			lwsl_parser("lws_parse calling handshake_04\n");
			if (handshake_0405(wsi->context, wsi)) {
				lwsl_notice("hs0405 has failed the connection\n");
				return 1;
			}
		}
		break;
	}

	lws_server_init_wsi_for_ws(wsi);
	lwsl_parser("accepted v%02d connection\n", wsi->ws->ietf_spec_revision);

#if defined(LWS_WITH_ACCESS_LOG)
	{
		char *uptr = "unknown method", combo[128], dotstar[64];
		int l = 14, meth = lws_http_get_uri_and_method(wsi, &uptr, &l);

		if (wsi->h2_stream_carries_ws)
			wsi->http.request_version = HTTP_VERSION_2;

		wsi->http.access_log.response = 101;

		lws_strnncpy(dotstar, uptr, l, sizeof(dotstar));
		l = lws_snprintf(combo, sizeof(combo), "%s (%s)", dotstar,
				 wsi->protocol->name);

		if (meth < 0)
			meth = 0;
		lws_prepare_access_log_info(wsi, combo, l, meth);
		lws_access_log(wsi);
	}
#endif

	lwsl_info("%s: %p: dropping ah on ws upgrade\n", __func__, wsi);
	lws_header_table_detach(wsi, 1);

	return 0;
}